

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AttributeRecordSet *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  StandardVariable *pSVar3;
  KString local_240;
  KString local_220;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_200;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  AttributeRecordSet *local_18;
  AttributeRecordSet *this_local;
  
  local_18 = this;
  this_local = (AttributeRecordSet *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"AttributeRecordSet:");
  poVar2 = std::operator<<(poVar2,"\n\tEntity ID:\n");
  EntityIdentifier::GetAsString_abi_cxx11_((KString *)&citr,&this->m_EntityID);
  UTILS::IndentString(&local_1d0,(KString *)&citr,2,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Attribute Records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumAttrRecs);
  std::operator<<(poVar2,"\n\tRecords:\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&citr);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&this->m_vAttrRec);
  local_200._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&this->m_vAttrRec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_200);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_240);
    UTILS::IndentString(&local_220,&local_240,1,'\t');
    std::operator<<(local_190,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString AttributeRecordSet::GetAsString() const
{
    KStringStream ss;

    ss << "AttributeRecordSet:"
       << "\n\tEntity ID:\n" << IndentString( m_EntityID.GetAsString(), 2 )
       << "\n\tNumber Of Attribute Records: " << m_ui16NumAttrRecs 
       << "\n\tRecords:\n";

    vector<StdVarPtr>::const_iterator citr = m_vAttrRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vAttrRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( ( *citr )->GetAsString(), 1 );
    }

    return ss.str();
}